

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whalesay.cpp
# Opt level: O2

string * __thiscall
Whale::Say_abi_cxx11_
          (string *__return_storage_ptr__,Whale *this,shared_ptr<IMessageHolder> *message)

{
  int iVar1;
  ostream *poVar2;
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  iVar1 = (*((message->super___shared_ptr<IMessageHolder,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_IMessageHolder[1])();
  poVar2 = std::operator<<(local_1a8," ");
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct((ulong)local_1d8,(char)iVar1);
  poVar2 = std::operator<<(poVar2,(string *)local_1d8);
  std::operator<<(poVar2,'\n');
  std::__cxx11::string::~string((string *)local_1d8);
  poVar2 = std::operator<<(local_1a8,"< ");
  (**((message->super___shared_ptr<IMessageHolder,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
     _vptr_IMessageHolder)(local_1d8);
  poVar2 = std::operator<<(poVar2,(string *)local_1d8);
  poVar2 = std::operator<<(poVar2," >");
  std::operator<<(poVar2,'\n');
  std::__cxx11::string::~string((string *)local_1d8);
  poVar2 = std::operator<<(local_1a8," ");
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct((ulong)local_1d8,(char)iVar1);
  poVar2 = std::operator<<(poVar2,(string *)local_1d8);
  std::operator<<(poVar2,'\n');
  std::__cxx11::string::~string((string *)local_1d8);
  poVar2 = std::operator<<(local_1a8,"    \\");
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<(local_1a8,"     \\");
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<(local_1a8,"      \\");
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<(local_1a8,"       \\                     .");
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<(local_1a8,"                             ==");
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<(local_1a8,"                            ===");
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<(local_1a8,"       /\"\"\"\"\"\"\"\"\"\"\"\"\"\"\"\"___/ ===");
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<(local_1a8,"  ~~~ {~~ ~~~~ ~~~ ~~~~ ~~ ~ /  ===- ~~~");
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<(local_1a8,"       \\______ o          __/");
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<(local_1a8,"        \\    \\        __/");
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<(local_1a8,"          \\____\\______/");
  std::operator<<(poVar2,'\n');
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

string Whale::Say(std::shared_ptr<IMessageHolder> message)
{
    std::stringstream ss;
    size_t length = message->GetLength();
	ss << " " << string(length,'_') << '\n';
	ss << "< " << message->GetMessage() << " >" << '\n';
	ss << " " << string(length,'_') << '\n';
	ss << "    \\" << '\n';
	ss << "     \\" << '\n';
	ss << "      \\" << '\n';
	ss << "       \\                     ." << '\n';
	ss << "                             ==" << '\n';
	ss << "                            ===" << '\n';
	ss << "       /\"\"\"\"\"\"\"\"\"\"\"\"\"\"\"\"___/ ===" << '\n';
	ss << "  ~~~ {~~ ~~~~ ~~~ ~~~~ ~~ ~ /  ===- ~~~" << '\n';
	ss << "       \\______ o          __/" << '\n';
	ss << "        \\    \\        __/" << '\n';
	ss << "          \\____\\______/" << '\n';

    return ss.str();
}